

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_>
coro_io::
async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,std::array<asio::const_buffer,2ul>&>
          (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *socket,
          array<asio::const_buffer,_2UL> *buffer)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_coro_io_hpp:204:43)>
  *this;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_coro_io_hpp:204:43)>
  cVar3;
  pair<std::error_code,_unsigned_long> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  LazyPromise<std::pair<std::error_code,_unsigned_long>_> *in_stack_fffffffffffffe68;
  
  puVar2 = (undefined8 *)operator_new(0xb0,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = 
    async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,std::array<asio::const_buffer,2ul>&>
    ;
    puVar2[1] = 
    async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,std::array<asio::const_buffer,2ul>&>
    ;
    this = (callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_coro_io_hpp:204:43)>
            *)(puVar2 + 0xd);
    puVar2[0x13] = in_RSI;
    puVar2[0x14] = in_RDX;
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::LazyPromise
              ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object(in_stack_fffffffffffffe68);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xa9));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xa9));
      callback_awaitor<std::pair<std::error_code,_unsigned_long>_>::callback_awaitor
                ((callback_awaitor<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      puVar2[0x11] = puVar2[0x13];
      puVar2[0x12] = puVar2[0x14];
      cVar3 = callback_awaitor_base<std::pair<std::error_code,unsigned_long>,coro_io::callback_awaitor<std::pair<std::error_code,unsigned_long>>>
              ::
              await_resume<coro_io::async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,std::array<asio::const_buffer,2ul>&>(asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&,std::array<asio::const_buffer,2ul>&)::_lambda(auto:1)_1_>
                        ((callback_awaitor_base<std::pair<std::error_code,_unsigned_long>,_coro_io::callback_awaitor<std::pair<std::error_code,_unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (anon_class_16_2_97def1c6 *)in_stack_fffffffffffffe48);
      *(callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_coro_io_hpp:204:43)>
        *)(puVar2 + 0xf) = cVar3;
      cVar3 = async_simple::coro::detail::LazyPromiseBase::
              await_transform<coro_io::callback_awaitor_base<std::pair<std::error_code,unsigned_long>,coro_io::callback_awaitor<std::pair<std::error_code,unsigned_long>>>::callback_awaitor_impl<coro_io::async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,std::array<asio::const_buffer,2ul>&>(asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&,std::array<asio::const_buffer,2ul>&)::_lambda(auto:1)_1_>>
                        ((LazyPromiseBase *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (callback_awaitor_impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_coro_io_hpp:204:43)>
                          *)in_stack_fffffffffffffe48);
      *this = cVar3;
      bVar1 = callback_awaitor_base<std::pair<std::error_code,_unsigned_long>,_coro_io::callback_awaitor<std::pair<std::error_code,_unsigned_long>_>_>
              ::
              callback_awaitor_impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/include/cinatra/ylt/coro_io/coro_io.hpp:204:43)>
              ::await_ready(this);
      if (bVar1) {
        callback_awaitor_base<std::pair<std::error_code,_unsigned_long>,_coro_io::callback_awaitor<std::pair<std::error_code,_unsigned_long>_>_>
        ::
        callback_awaitor_impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/include/cinatra/ylt/coro_io/coro_io.hpp:204:43)>
        ::await_resume(this);
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        return_value<std::pair<std::error_code,_unsigned_long>_>
                  ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe48);
        async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar2 + 2));
        bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                          ((FinalAwaiter *)((long)puVar2 + 0xaa));
        if (bVar1) {
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xaa));
          async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
          ~LazyPromise((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)0x40d780);
          if (puVar2 != (undefined8 *)0x0) {
            operator_delete(puVar2,0xb0);
          }
        }
        else {
          *puVar2 = 0;
          async_write((void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          (*(code *)*extraout_RAX)(extraout_RAX);
        }
      }
      else {
        *(undefined1 *)(puVar2 + 0x15) = 1;
        async_write((void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                    (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
    }
    else {
      *(undefined1 *)(puVar2 + 0x15) = 0;
      async_write((void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                  (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

inline async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_write(
    Socket &socket, AsioBuffer &&buffer) noexcept {
  callback_awaitor<std::pair<std::error_code, size_t>> awaitor;
  co_return co_await awaitor.await_resume([&](auto handler) {
    asio::async_write(socket, buffer, [&, handler](const auto &ec, auto size) {
      handler.set_value_then_resume(ec, size);
    });
  });
}